

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_thread_terminate(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread)

{
  int iVar1;
  sexp in_RCX;
  sexp_conflict in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  bool bVar2;
  sexp_conflict res;
  sexp_conflict local_8;
  
  local_8 = (sexp_conflict)0x3e;
  if (in_RDI == in_RCX) {
    local_8 = (sexp_conflict)&DAT_0000013e;
  }
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x24)) {
    while( true ) {
      bVar2 = false;
      if ((in_RCX != (sexp_conflict)0x0) && (bVar2 = false, ((ulong)in_RCX & 3) == 0)) {
        bVar2 = in_RCX->tag == 0x24;
      }
      if (!bVar2) break;
      if (0 < (in_RDI->value).context.refuel) {
        (in_RCX->value).flonum_bits[0x60a4] = '\x01';
        (in_RCX->value).context.result =
             (sexp)(((in_RDI->value).type.setters)->value).context.mark_stack[9].start;
        (in_RCX->value).context.refuel = 0;
      }
      iVar1 = sexp_delete_list(in_RDI,0x2c,in_RCX);
      if (iVar1 != 0) {
        sexp_thread_start(in_RSI,in_RDX,(sexp_sint_t)in_RCX,local_8);
      }
      in_RCX = (in_RCX->value).type.getters;
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x24,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_thread_terminate (sexp ctx, sexp self, sexp_sint_t n, sexp thread) {
  sexp res = sexp_make_boolean(ctx == thread);
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  /* terminate the thread and all children */
  for ( ; thread && sexp_contextp(thread); thread=sexp_context_child(thread)) {
    /* if not already terminated set an exception status */
    if (sexp_context_refuel(ctx) > 0) {
      sexp_context_errorp(thread) = 1;
      sexp_context_result(thread) =
        sexp_global(ctx, SEXP_G_THREAD_TERMINATE_ERROR);
      /* zero the refuel - this tells the scheduler the thread is terminated */
      sexp_context_refuel(thread) = 0;
    }
    /* unblock the thread if needed so it can be scheduled and terminated */
    if (sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread))
      sexp_thread_start(ctx, self, 1, thread);
  }
  /* return true if terminating self, then we can yield */
  return res;
}